

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

string * __thiscall TCLAP::Arg::getDescription_abi_cxx11_(string *__return_storage_ptr__,Arg *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator local_1a;
  undefined1 local_19;
  Arg *local_18;
  Arg *this_local;
  string *desc;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Arg *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  if ((this->_required & 1U) != 0) {
    std::operator+(&local_70,"(",&this->_requireLabel);
    std::operator+(&local_50,&local_70,")  ");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&this->_description);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Arg::getDescription() const
{
	std::string desc = "";
	if ( _required )
		desc = "(" + _requireLabel + ")  ";

//	if ( _valueRequired )
//		desc += "(value required)  ";

	desc += _description;
	return desc;
}